

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void iDynTree::addLinkToTraversal
               (Model *model,Traversal *traversal,LinkIndex linkToAdd,JointIndex parentJointToAdd,
               LinkIndex parentLinkToAdd,
               deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_> *linkToVisit)

{
  Model *this;
  Link *parentLink;
  value_type *in_RSI;
  Traversal *in_R9;
  stackEl el;
  Model *in_stack_ffffffffffffffb0;
  IJoint *in_stack_ffffffffffffffc0;
  Link *in_stack_ffffffffffffffc8;
  
  this = (Model *)Model::getLink(in_stack_ffffffffffffffb0,(LinkIndex)in_RSI);
  parentLink = (Link *)Model::getJoint(this,(JointIndex)in_RSI);
  Model::getLink(this,(LinkIndex)in_RSI);
  Traversal::addTraversalElement
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,parentLink);
  Model::getLink(this,(LinkIndex)in_RSI);
  Model::getLink(this,(LinkIndex)in_RSI);
  std::deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_>::push_back
            ((deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_> *)this,in_RSI);
  return;
}

Assistant:

void addLinkToTraversal(const Model & model, Traversal & traversal,
                        LinkIndex linkToAdd, JointIndex parentJointToAdd, LinkIndex parentLinkToAdd,
                        std::deque<stackEl> & linkToVisit)
{
    traversal.addTraversalElement(model.getLink(linkToAdd),
                                  model.getJoint(parentJointToAdd),
                                  model.getLink(parentLinkToAdd));

    stackEl el;
    el.link = model.getLink(linkToAdd);
    el.parent = model.getLink(parentLinkToAdd);

    linkToVisit.push_back(el);
}